

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::getChunkSize
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,qint64 *chunkSize)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  qsizetype n;
  int iVar6;
  qint64 qVar7;
  long in_FS_OFFSET;
  QByteArrayView local_70;
  QByteArrayView local_60;
  char c;
  undefined1 auStack_4f [15];
  bool ok;
  char crlf [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  crlf[0] = -0x56;
  crlf[1] = -0x56;
  *chunkSize = -1;
  iVar3 = (**(code **)(*(long *)socket + 0xa0))(socket);
  qVar7 = 0;
  do {
    if (iVar3 <= qVar7) {
LAB_001f5bc2:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return qVar7;
      }
      __stack_chk_fail();
    }
    lVar4 = QIODevice::peek((char *)socket,(longlong)crlf);
    lVar5 = (this->fragment).d.size;
    iVar6 = (int)lVar5;
    if (((((lVar4 == 2) && (iVar6 != 0)) && (crlf[0] == '\r')) && (crlf[1] == '\n')) ||
       ((1 < iVar6 && (crlf[0] == '\n' && (this->fragment).d.ptr[lVar5 + -1] == '\r')))) {
      lVar5 = QIODevice::read((char *)socket,(longlong)crlf);
      qVar7 = lVar5 + qVar7;
      if (crlf[0] == '\r') {
        lVar5 = QIODevice::read((char *)socket,(longlong)crlf);
        qVar7 = qVar7 + lVar5;
      }
      ok = false;
      local_70.m_data = (this->fragment).d.ptr;
      local_70.m_size = (this->fragment).d.size;
      n = QByteArray::indexOf(&this->fragment,';',0);
      local_60 = QByteArrayView::mid(&local_70,0,n);
      _c = QByteArrayView::trimmed(&local_60);
      lVar5 = QByteArrayView::toLong((QByteArrayView *)&c,&ok,0x10);
      *chunkSize = lVar5;
      QByteArray::clear();
      goto LAB_001f5bc2;
    }
    auVar2[0xf] = 0;
    auVar2._0_15_ = auStack_4f;
    _c = (QByteArrayView)(auVar2 << 8);
    lVar5 = QIODevice::read((char *)socket,(longlong)&c);
    if (lVar5 < 0) {
      qVar7 = -1;
      goto LAB_001f5bc2;
    }
    qVar7 = qVar7 + lVar5;
    QByteArray::append((char)&this->fragment);
  } while( true );
}

Assistant:

qint64 QHttpNetworkReplyPrivate::getChunkSize(QIODevice *socket, qint64 *chunkSize)
{
    qint64 bytes = 0;
    char crlf[2];
    *chunkSize = -1;

    int bytesAvailable = socket->bytesAvailable();
    // FIXME rewrite to permanent loop without bytesAvailable
    while (bytesAvailable > bytes) {
        qint64 sniffedBytes = socket->peek(crlf, 2);
        int fragmentSize = fragment.size();

        // check the next two bytes for a "\r\n", skip blank lines
        if ((fragmentSize && sniffedBytes == 2 && crlf[0] == '\r' && crlf[1] == '\n')
           ||(fragmentSize > 1 && fragment.endsWith('\r')  && crlf[0] == '\n'))
        {
            bytes += socket->read(crlf, 1);     // read the \r or \n
            if (crlf[0] == '\r')
                bytes += socket->read(crlf, 1); // read the \n
            bool ok = false;
            // ignore the chunk-extension
            const auto fragmentView = QByteArrayView(fragment).mid(0, fragment.indexOf(';')).trimmed();
            *chunkSize = fragmentView.toLong(&ok, 16);
            fragment.clear();
            break; // size done
        } else {
            // read the fragment to the buffer
            char c = 0;
            qint64 haveRead = socket->read(&c, 1);
            if (haveRead < 0) {
                return -1; // FIXME
            }
            bytes += haveRead;
            fragment.append(c);
        }
    }

    return bytes;
}